

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

int N_VInvTest_SensWrapper(N_Vector x,N_Vector z)

{
  long *in_RDI;
  int tmp;
  int no_zero_found;
  int i;
  N_Vector in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = 1;
  for (local_14 = 0; local_14 < *(int *)(*in_RDI + 8); local_14 = local_14 + 1) {
    in_stack_ffffffffffffffe4 =
         N_VInvTest((N_Vector)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8);
    if (in_stack_ffffffffffffffe4 != 1) {
      local_18 = 0;
    }
  }
  return local_18;
}

Assistant:

booleantype N_VInvTest_SensWrapper(N_Vector x, N_Vector z)
{
  int i;
  booleantype no_zero_found, tmp;

  no_zero_found = SUNTRUE;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VInvTest(NV_VEC_SW(x,i), NV_VEC_SW(z,i));
    if (tmp != SUNTRUE) no_zero_found = SUNFALSE;
  }

  return(no_zero_found);
}